

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::ES>
::test_shader_compilation
          (ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  TestError *pTVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  string shader_source;
  string shader_source_1;
  string base_variable_string_1;
  string base_variable_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  TestShaderType local_1cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  long local_160;
  long *local_118;
  long local_110;
  long local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  string local_98;
  string local_78;
  long *local_58 [2];
  long local_48 [2];
  undefined8 local_38;
  
  lVar4 = 0x2238c78;
  if (supported_variable_types_map._16_8_ != 0) {
    lVar4 = 0x2238c78;
    lVar6 = supported_variable_types_map._16_8_;
    do {
      if (*(int *)Interface::ES::var_types <= *(int *)(lVar6 + 0x20)) {
        lVar4 = lVar6;
      }
      lVar6 = *(long *)(lVar6 + 0x10 +
                       (ulong)(*(int *)(lVar6 + 0x20) < *(int *)Interface::ES::var_types) * 8);
    } while (lVar6 != 0);
  }
  local_160 = 0x2238c78;
  if ((lVar4 != 0x2238c78) &&
     (local_160 = lVar4, *(int *)Interface::ES::var_types < *(int *)(lVar4 + 0x20))) {
    local_160 = 0x2238c78;
  }
  local_38 = 0;
  local_1cc = tested_shader_type;
  if (local_160 == 0x2238c78) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Type not found.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x7d5);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_160 + 0x28);
  std::operator+(&local_1f0,"    ",local_188);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  local_118 = &local_108;
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_108 = *plVar5;
    uStack_100 = (undefined4)plVar1[3];
    uStack_fc = *(undefined4 *)((long)plVar1 + 0x1c);
  }
  else {
    local_108 = *plVar5;
    local_118 = (long *)*plVar1;
  }
  local_110 = plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"[]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&local_180,this,&local_118,(string *)local_58,2);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_180);
  lVar6 = local_160;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,*(long *)(local_160 + 0x28),
             *(long *)(local_160 + 0x30) + *(long *)(local_160 + 0x28));
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  lVar4 = *(long *)(lVar6 + 0x68);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,lVar4,*(long *)(lVar6 + 0x70) + lVar4);
  recursively_initialise(&local_1f0,this,&local_78,2,&local_98);
  std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1f0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_180);
  std::operator+(&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &shader_start_abi_cxx11_,&local_180);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_1cc) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x7cd);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar7 = (ulong)local_1cc;
  puVar2 = &set_tesseation_abi_cxx11_;
  switch(uVar7) {
  case 1:
    std::__cxx11::string::append((char *)&local_1f0);
    break;
  case 3:
    puVar2 = &emit_quad_abi_cxx11_;
  case 4:
    std::__cxx11::string::_M_append((char *)&local_1f0,*puVar2);
  }
  std::__cxx11::string::_M_append((char *)&local_1f0,shader_end_abi_cxx11_);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_1cc) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,2000);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*(code *)(&DAT_01b171f8 + *(int *)(&DAT_01b171f8 + uVar7 * 4)))();
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclConstructors1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	//vec4 color = vec4(0.0, 1.0, 0.0, 1.0);
	int num_var_types = API::n_var_types;

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t max_dimension_index = 2; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
			{
				std::string base_variable_string =
					this->extend_string("    " + var_iterator->second.type + " a", "[]", max_dimension_index);

				base_variable_string += " = ";
				base_variable_string += recursively_initialise(var_iterator->second.type, max_dimension_index,
															   var_iterator->second.initializer_with_ones);
				base_variable_string += ";\n\n";

				std::string shader_source = shader_start + base_variable_string;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
			} /* for (int max_dimension_index = 1; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_structure = "struct my_structure\n";

			base_structure += "{\n";
			base_structure += "    " + var_iterator->second.type + " b;\n";
			base_structure += "    " + var_iterator->second.type + " c;\n";
			base_structure += "};\n\n";

			for (size_t max_dimension_index = 1; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
			{
				std::string outer_separator = "(";
				std::string base_variable_string;

				base_variable_string +=
					this->extend_string("    " + var_iterator->second.type + " a", "[2]", max_dimension_index);
				base_variable_string += " = ";
				base_variable_string += recursively_initialise(var_iterator->second.type, max_dimension_index,
															   var_iterator->second.initializer_with_ones);
				base_variable_string += ";\n\n";

				std::string shader_source = base_structure + shader_start + base_variable_string;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
			} /* for (int max_dimension_index = 1; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}